

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  undefined4 uVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  io_context io_context;
  error_code ignored_error;
  string message;
  data_union local_f0;
  socket client;
  acceptor acceptor;
  
  signal(2,main::anon_class_1_0_00000001::__invoke);
  asio::io_context::io_context(&io_context);
  client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.protocol_.
  family_ = 0;
  client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.socket_ = 0;
  client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.state_ = '\0';
  client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type._5_3_ = 0;
  client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.reactor_data_ = (per_descriptor_data)0x0;
  client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.service_ =
       (service_type *)0xc3220002;
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
  basic_socket_acceptor<asio::io_context>(&acceptor,&io_context,(endpoint_type *)&client,true,0);
  poVar2 = std::operator<<((ostream *)&std::cout,"loccal addr info: \n addr: ");
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::local_endpoint
            ((endpoint_type *)&message,&acceptor);
  if ((ushort)message._M_dataplus._M_p != 2) {
    client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.
    super_base_implementation_type.socket_ = (undefined4)message._M_string_length;
    client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.
    super_base_implementation_type.state_ = message._M_string_length._4_1_;
    client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.
    super_base_implementation_type._5_3_ = message._M_string_length._5_3_;
    client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.
    super_base_implementation_type.reactor_data_ =
         (per_descriptor_data)message.field_2._M_allocated_capacity;
    client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.protocol_.
    family_ = message.field_2._8_4_;
    uVar1 = 0;
  }
  else {
    client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.
    super_base_implementation_type.socket_ = 0;
    client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.
    super_base_implementation_type.state_ = '\0';
    client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.
    super_base_implementation_type._5_3_ = 0;
    client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.
    super_base_implementation_type.reactor_data_ = (per_descriptor_data)0x0;
    client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.protocol_.
    family_ = 0;
    uVar1 = message._M_dataplus._M_p._4_4_;
  }
  client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.service_ =
       (service_type *)CONCAT44(uVar1,(uint)((ushort)message._M_dataplus._M_p != 2));
  pbVar3 = asio::ip::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar2,(address *)&client);
  std::endl<char,std::char_traits<char>>((ostream *)pbVar3);
  poVar2 = std::operator<<((ostream *)&std::cout,"port: ");
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::local_endpoint
            ((endpoint_type *)&client,&acceptor);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.
                             service_._2_2_ << 8 |
                             client.super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.
                             service_._2_2_ >> 8);
  std::endl<char,std::char_traits<char>>(poVar2);
  while (((byte)g_running._M_base._M_i & 1) != 0) {
    asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::basic_socket<asio::io_context>
              ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)&client,&io_context,0);
    asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
    accept<asio::ip::tcp,asio::any_io_executor>
              ((basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor> *)&acceptor,
               (basic_socket<asio::ip::tcp,_asio::any_io_executor> *)&client,0);
    make_daytime_string_abi_cxx11_();
    poVar2 = std::operator<<((ostream *)&std::cout,"msg : ");
    poVar2 = std::operator<<(poVar2,(string *)&message);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"peer client addr = ");
    asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::remote_endpoint
              ((endpoint_type *)&local_f0.base,
               (basic_socket<asio::ip::tcp,_asio::any_io_executor> *)&client);
    if (local_f0.base.sa_family != 2) {
      ignored_error._M_cat = (error_category *)local_f0.v4.sin_zero;
      local_f0.v6.sin6_flowinfo = 0;
    }
    else {
      ignored_error._M_cat = (error_category *)0x0;
    }
    ignored_error._M_value = (int)(local_f0.base.sa_family != 2);
    ignored_error._4_4_ = local_f0.v4.sin_addr.s_addr;
    pbVar3 = asio::ip::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)poVar2,
                        (address *)&ignored_error);
    std::endl<char,std::char_traits<char>>((ostream *)pbVar3);
    ignored_error._M_value = 0;
    ignored_error._M_cat = (error_category *)std::_V2::system_category();
    local_f0._0_8_ = message._M_string_length;
    if (message._M_string_length != 0) {
      local_f0._0_8_ =
           CONCAT44(message._M_dataplus._M_p._4_4_,(uint)(ushort)message._M_dataplus._M_p);
    }
    local_f0.base.sa_data[6] = (undefined1)message._M_string_length;
    local_f0.base.sa_data[7] = message._M_string_length._1_1_;
    local_f0.base.sa_data[8] = message._M_string_length._2_1_;
    local_f0.base.sa_data[9] = message._M_string_length._3_1_;
    local_f0.base.sa_data[10] = message._M_string_length._4_1_;
    local_f0.base.sa_data[0xb] = message._M_string_length._5_1_;
    local_f0.base.sa_data[0xc] = message._M_string_length._6_1_;
    local_f0.base.sa_data[0xd] = message._M_string_length._7_1_;
    asio::
    write<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffers_1,asio::detail::transfer_all_t>
              ((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                *)&client,&local_f0,(address *)&ignored_error,0);
    std::__cxx11::string::~string((string *)&message);
    asio::detail::
    io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
    ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                     *)&client);
  }
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl(&acceptor.impl_);
  asio::execution_context::~execution_context(&io_context.super_execution_context);
  poVar2 = std::operator<<((ostream *)&std::cout,"main process exit.... ");
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int main() {
    // SIGINT handler
    signal(SIGINT, [](int sig) {
        g_running = false;
        std::cout << "ctrl+c is pressed .. exit...." <<std::endl;
    });
    
    try {
        asio::io_context io_context;
        tcp::acceptor acceptor(io_context, tcp::endpoint(tcp::v4(), 8899));
        
        std::cout << "loccal addr info: \n addr: " << acceptor.local_endpoint().address() << std::endl;
        std::cout << "port: " << acceptor.local_endpoint().port() << std::endl;
        
        while (g_running) {
            tcp::socket client(io_context);
            acceptor.accept(client);
            std::string message = make_daytime_string();
            std::cout << "msg : " << message  <<std::endl;
            std::cout << "peer client addr = " << client.remote_endpoint().address() << std::endl;

            asio::error_code ignored_error;
            asio::write(client, asio::buffer(message), ignored_error);
            //socket.read_some(asio::buffer(message));   //sync
        }
     } catch (std::exception& e) {
         std::cerr << e.what() << std::endl;
     }

     std::cout << "main process exit.... " <<std::endl;
     return 0;
}